

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JammingTechnique.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::JammingTechnique::Encode(JammingTechnique *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  JammingTechnique *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8Kind);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Category);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Subcategory);
  KDataStream::operator<<(pKVar1,this->m_ui8Specific);
  return;
}

Assistant:

void JammingTechnique::Encode( KDataStream & stream ) const
{
    stream << m_ui8Kind
           << m_ui8Category
           << m_ui8Subcategory
           << m_ui8Specific;
}